

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
DescriptorKeyInfo_Constructor_ExtPubkey_Test::TestBody
          (DescriptorKeyInfo_Constructor_ExtPubkey_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_9c8;
  Message local_9c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b8;
  string local_998;
  undefined1 local_978 [8];
  AssertionResult gtest_ar_4;
  Message local_960;
  ExtPubkey local_958;
  string local_8e8;
  undefined1 local_8c8 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_898;
  Message local_890;
  bool local_881;
  undefined1 local_880 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_850;
  Message local_848;
  bool local_839;
  undefined1 local_838 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_808;
  Message local_800;
  bool local_7f1;
  undefined1 local_7f0 [8];
  AssertionResult gtest_ar_;
  Message local_7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  undefined1 local_770 [8];
  AssertionResult gtest_ar_2;
  Message local_758;
  string local_750;
  AssertHelper local_730;
  Message local_728;
  string local_720;
  string local_700;
  DescriptorKeyInfo local_6e0;
  AssertHelper local_540;
  Message local_538;
  DescriptorKeyType local_530;
  DescriptorKeyType local_52c;
  undefined1 local_528 [8];
  AssertionResult gtest_ar_1;
  Message local_510;
  undefined1 local_508 [8];
  AssertionResult gtest_ar;
  Message local_4f0;
  string local_4e8;
  AssertHelper local_4c8;
  Message local_4c0;
  allocator local_4b1;
  string local_4b0;
  allocator local_489;
  string local_488;
  DescriptorKeyInfo local_468;
  string local_2c8 [8];
  string key_str;
  DescriptorKeyInfo key_info;
  undefined1 local_100 [8];
  string path;
  undefined1 local_d8 [8];
  string parent_info;
  ExtPubkey pubkey;
  allocator local_31;
  undefined1 local_30 [8];
  string extkey;
  DescriptorKeyInfo_Constructor_ExtPubkey_Test *this_local;
  
  extkey.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "tpubDDNapBCUaChXpE91grWNGp8xWg84GcS1iRSR7iynAFTv6JAGnKTEUB3vkHtsV4NbkZf6SfjYM6PvW3kZ77KLUZ2GTYNBN4PJRWCKN1ERjJe"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::ExtPubkey::ExtPubkey((ExtPubkey *)((long)&parent_info.field_2 + 8),(string *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_d8,"[ef57314e/0\'/1]",(allocator *)(path.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(path.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_100,"0/1/*",
             (allocator *)(key_info.key_string_.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(key_info.key_string_.field_2._M_local_buf + 0xf));
  cfd::core::DescriptorKeyInfo::DescriptorKeyInfo((DescriptorKeyInfo *)((long)&key_str.field_2 + 8))
  ;
  std::__cxx11::string::string(local_2c8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_488,"",&local_489);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_4b0,"",&local_4b1);
      cfd::core::DescriptorKeyInfo::DescriptorKeyInfo
                (&local_468,(ExtPubkey *)((long)&parent_info.field_2 + 8),&local_488,&local_4b0);
      cfd::core::DescriptorKeyInfo::operator=
                ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8),&local_468);
      cfd::core::DescriptorKeyInfo::~DescriptorKeyInfo(&local_468);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
      std::__cxx11::string::~string((string *)&local_488);
      std::allocator<char>::~allocator((allocator<char> *)&local_489);
    }
  }
  else {
    testing::Message::Message(&local_4c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_4c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5b3,
               "Expected: key_info = DescriptorKeyInfo(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_4c8,&local_4c0);
    testing::internal::AssertHelper::~AssertHelper(&local_4c8);
    testing::Message::~Message(&local_4c0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::DescriptorKeyInfo::ToString_abi_cxx11_
                (&local_4e8,(DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
      std::__cxx11::string::operator=(local_2c8,(string *)&local_4e8);
      std::__cxx11::string::~string((string *)&local_4e8);
    }
  }
  else {
    testing::Message::Message(&local_4f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5b4,
               "Expected: key_str = key_info.ToString() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_4f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_4f0);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_508,"key_str.c_str()","extkey.c_str()",pcVar2,pcVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_508);
  if (!bVar1) {
    testing::Message::Message(&local_510);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_508);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5b5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_510);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_510);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_508);
  local_52c = cfd::core::DescriptorKeyInfo::GetKeyType
                        ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
  local_530 = kDescriptorKeyBip32;
  testing::internal::EqHelper<false>::
  Compare<cfd::core::DescriptorKeyType,cfd::core::DescriptorKeyType>
            ((EqHelper<false> *)local_528,"key_info.GetKeyType()",
             "DescriptorKeyType::kDescriptorKeyBip32",&local_52c,&local_530);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_528);
  if (!bVar1) {
    testing::Message::Message(&local_538);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_528);
    testing::internal::AssertHelper::AssertHelper
              (&local_540,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5b6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_540,&local_538);
    testing::internal::AssertHelper::~AssertHelper(&local_540);
    testing::Message::~Message(&local_538);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_528);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_700,(string *)local_d8);
      std::__cxx11::string::string((string *)&local_720,(string *)local_100);
      cfd::core::DescriptorKeyInfo::DescriptorKeyInfo
                (&local_6e0,(ExtPubkey *)((long)&parent_info.field_2 + 8),&local_700,&local_720);
      cfd::core::DescriptorKeyInfo::operator=
                ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8),&local_6e0);
      cfd::core::DescriptorKeyInfo::~DescriptorKeyInfo(&local_6e0);
      std::__cxx11::string::~string((string *)&local_720);
      std::__cxx11::string::~string((string *)&local_700);
    }
  }
  else {
    testing::Message::Message(&local_728);
    testing::internal::AssertHelper::AssertHelper
              (&local_730,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5b8,
               "Expected: key_info = DescriptorKeyInfo(pubkey, parent_info, path) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_730,&local_728);
    testing::internal::AssertHelper::~AssertHelper(&local_730);
    testing::Message::~Message(&local_728);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::DescriptorKeyInfo::ToString_abi_cxx11_
                (&local_750,(DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
      std::__cxx11::string::operator=(local_2c8,(string *)&local_750);
      std::__cxx11::string::~string((string *)&local_750);
    }
  }
  else {
    testing::Message::Message(&local_758);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5b9,
               "Expected: key_str = key_info.ToString() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_758);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_758);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::operator+(&local_7d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  std::operator+(&local_7b0,&local_7d0,"/");
  std::operator+(&local_790,&local_7b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_770,"key_str.c_str()","(parent_info + extkey + \"/\" + path).c_str()"
             ,pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_790);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::__cxx11::string::~string((string *)&local_7d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_770);
  if (!bVar1) {
    testing::Message::Message(&local_7d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_770);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5ba,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_7d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_7d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_770);
  bVar1 = cfd::core::DescriptorKeyInfo::HasPrivkey
                    ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
  local_7f1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7f0,&local_7f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f0);
  if (!bVar1) {
    testing::Message::Message(&local_800);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_7f0,
               (AssertionResult *)"key_info.HasPrivkey()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_808,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5bb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_808,&local_800);
    testing::internal::AssertHelper::~AssertHelper(&local_808);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_800);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f0);
  local_839 = cfd::core::DescriptorKeyInfo::HasExtPubkey
                        ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_838,&local_839,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_838);
  if (!bVar1) {
    testing::Message::Message(&local_848);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_838,
               (AssertionResult *)"key_info.HasExtPubkey()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_850,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5bc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_850,&local_848);
    testing::internal::AssertHelper::~AssertHelper(&local_850);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_848);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_838);
  bVar1 = cfd::core::DescriptorKeyInfo::HasExtPrivkey
                    ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
  local_881 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_880,&local_881,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_880);
  if (!bVar1) {
    testing::Message::Message(&local_890);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_880,
               (AssertionResult *)"key_info.HasExtPrivkey()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_898,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5bd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_898,&local_890);
    testing::internal::AssertHelper::~AssertHelper(&local_898);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_890);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_880);
  cfd::core::DescriptorKeyInfo::GetExtPubkey
            (&local_958,(DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
  cfd::core::ExtPubkey::ToString_abi_cxx11_(&local_8e8,&local_958);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_8c8,"key_info.GetExtPubkey().ToString().c_str()","extkey.c_str()",
             pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_8e8);
  cfd::core::ExtPubkey::~ExtPubkey(&local_958);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8c8);
  if (!bVar1) {
    testing::Message::Message(&local_960);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5be,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_960);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_960);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c8);
  cfd::core::DescriptorKeyInfo::GetBip32Path_abi_cxx11_
            (&local_998,(DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::operator+(&local_9b8,"/",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_978,"key_info.GetBip32Path().c_str()","(\"/\" + path).c_str()",pcVar2
             ,pcVar3);
  std::__cxx11::string::~string((string *)&local_9b8);
  std::__cxx11::string::~string((string *)&local_998);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_978);
  if (!bVar1) {
    testing::Message::Message(&local_9c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_978);
    testing::internal::AssertHelper::AssertHelper
              (&local_9c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x5bf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9c8,&local_9c0);
    testing::internal::AssertHelper::~AssertHelper(&local_9c8);
    testing::Message::~Message(&local_9c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_978);
  std::__cxx11::string::~string(local_2c8);
  cfd::core::DescriptorKeyInfo::~DescriptorKeyInfo
            ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)local_d8);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)((long)&parent_info.field_2 + 8));
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(DescriptorKeyInfo, Constructor_ExtPubkey) {
  std::string extkey = "tpubDDNapBCUaChXpE91grWNGp8xWg84GcS1iRSR7iynAFTv6JAGnKTEUB3vkHtsV4NbkZf6SfjYM6PvW3kZ77KLUZ2GTYNBN4PJRWCKN1ERjJe";
  ExtPubkey pubkey(extkey);
  std::string parent_info = "[ef57314e/0'/1]";
  std::string path = "0/1/*";
  DescriptorKeyInfo key_info;
  std::string key_str;

  EXPECT_NO_THROW(key_info = DescriptorKeyInfo(pubkey));
  EXPECT_NO_THROW(key_str = key_info.ToString());
  EXPECT_STREQ(key_str.c_str(), extkey.c_str());
  EXPECT_EQ(key_info.GetKeyType(),  DescriptorKeyType::kDescriptorKeyBip32);

  EXPECT_NO_THROW(key_info = DescriptorKeyInfo(pubkey, parent_info, path));
  EXPECT_NO_THROW(key_str = key_info.ToString());
  EXPECT_STREQ(key_str.c_str(), (parent_info + extkey + "/" + path).c_str());
  EXPECT_FALSE(key_info.HasPrivkey());
  EXPECT_TRUE(key_info.HasExtPubkey());
  EXPECT_FALSE(key_info.HasExtPrivkey());
  EXPECT_STREQ(key_info.GetExtPubkey().ToString().c_str(),  extkey.c_str());
  EXPECT_STREQ(key_info.GetBip32Path().c_str(),  ("/" + path).c_str());
}